

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

LoopEvent rec_itern(jit_State *J,BCReg ra,BCReg rb)

{
  uint slot;
  uint uVar1;
  TValue *pTVar2;
  int iVar3;
  TRef *pTVar4;
  LoopEvent LVar5;
  RecordIndex ix;
  
  if (((((J->pc == J->startpc) && (J->framedepth + J->retdepth == 0)) && (J->parent == 0)) &&
      (J->exitno == 0)) &&
     ((uVar1 = (J->cur).nins, 0x8002 < uVar1 ||
      ((uVar1 == 0x8002 && (*(char *)((long)(J->cur).ir + 0x4000d) != '\x15')))))) {
    J->instunroll = 0;
    LVar5 = LOOPEV_ENTER;
    lj_record_stop(J,LJ_TRLINK_LOOP,(uint)(J->cur).traceno);
  }
  else {
    J->maxslot = ra;
    lj_snap_add(J);
    pTVar4 = J->base;
    uVar1 = ra - 2;
    ix.tab = pTVar4[uVar1];
    if (ix.tab == 0) {
      ix.tab = sload(J,uVar1);
      pTVar4 = J->base;
    }
    slot = ra - 1;
    ix.key = pTVar4[slot];
    if (ix.key == 0) {
      ix.key = sloadt(J,slot,IRT_GUARD|IRT_INT,0x44);
    }
    pTVar2 = J->L->base;
    ix.tabv = pTVar2[uVar1];
    ix.keyv = pTVar2[slot];
    ix.idxchain = (int)(rb < 3);
    ix.mobj = 1;
    iVar3 = lj_record_next(J,&ix);
    J->maxslot = iVar3 + ra;
    J->needsnap = '\x01';
    if ((ix.key & 0x1f000000) == 0) {
      J->maxslot = ra - 3;
      J->pc = J->pc + 2;
      LVar5 = LOOPEV_LEAVE;
    }
    else {
      pTVar4 = J->base;
      pTVar4[slot] = ix.mobj | 0x100000;
      pTVar4[ra] = ix.key;
      pTVar4[ra + 1] = ix.val;
      J->pc = J->pc + ((ulong)*(ushort *)((long)J->pc + 6) - 0x7ffe);
      LVar5 = LOOPEV_ENTER;
    }
  }
  return LVar5;
}

Assistant:

static LoopEvent rec_itern(jit_State *J, BCReg ra, BCReg rb)
{
#if LJ_BE
  /* YAGNI: Disabled on big-endian due to issues with lj_vm_next,
  ** IR_HIOP, RID_RETLO/RID_RETHI and ra_destpair.
  */
  UNUSED(ra); UNUSED(rb);
  setintV(&J->errinfo, (int32_t)BC_ITERN);
  lj_trace_err_info(J, LJ_TRERR_NYIBC);
#else
  RecordIndex ix;
  /* Since ITERN is recorded at the start, we need our own loop detection. */
  if (J->pc == J->startpc &&
      J->framedepth + J->retdepth == 0 && J->parent == 0 && J->exitno == 0) {
    IRRef ref = REF_FIRST + LJ_HASPROFILE;
#ifdef LUAJIT_ENABLE_CHECKHOOK
    ref += 3;
#endif
    if (J->cur.nins > ref ||
       (LJ_HASPROFILE && J->cur.nins == ref && J->cur.ir[ref-1].o != IR_PROF)) {
      J->instunroll = 0;  /* Cannot continue unrolling across an ITERN. */
      lj_record_stop(J, LJ_TRLINK_LOOP, J->cur.traceno);  /* Looping trace. */
      return LOOPEV_ENTER;
    }
  }
  J->maxslot = ra;
  lj_snap_add(J);  /* Required to make JLOOP the first ins in a side-trace. */
  ix.tab = getslot(J, ra-2);
  ix.key = J->base[ra-1] ? J->base[ra-1] :
	   sloadt(J, (int32_t)(ra-1), IRT_GUARD|IRT_INT,
		  IRSLOAD_TYPECHECK|IRSLOAD_KEYINDEX);
  copyTV(J->L, &ix.tabv, &J->L->base[ra-2]);
  copyTV(J->L, &ix.keyv, &J->L->base[ra-1]);
  ix.idxchain = (rb < 3);  /* Omit value type check, if unused. */
  ix.mobj = 1;  /* We need the next index, too. */
  J->maxslot = ra + lj_record_next(J, &ix);
  J->needsnap = 1;
  if (!tref_isnil(ix.key)) {  /* Looping back? */
    J->base[ra-1] = ix.mobj | TREF_KEYINDEX;  /* Control var has next index. */
    J->base[ra] = ix.key;
    J->base[ra+1] = ix.val;
    J->pc += bc_j(J->pc[1])+2;
    return LOOPEV_ENTER;
  } else {
    J->maxslot = ra-3;
    J->pc += 2;
    return LOOPEV_LEAVE;
  }
#endif
}